

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddot.c
# Opt level: O1

double ddot_(int *n,double *sx,int *incx,double *sy,int *incy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  
  lVar3 = (long)*n;
  if (lVar3 < 1) {
    return 0.0;
  }
  iVar1 = *incx;
  iVar2 = *incy;
  if (iVar2 == 1 && iVar1 == 1) {
    if (*n < 5) {
      dVar8 = 0.0;
      lVar5 = 0;
    }
    else {
      dVar8 = 0.0;
      lVar5 = 0;
      do {
        dVar8 = dVar8 + sx[lVar5 + 4] * sy[lVar5 + 4] +
                        sx[lVar5 + 3] * sy[lVar5 + 3] +
                        sx[lVar5 + 2] * sy[lVar5 + 2] +
                        sx[lVar5] * sy[lVar5] + sx[lVar5 + 1] * sy[lVar5 + 1];
        lVar5 = lVar5 + 5;
      } while (lVar5 < lVar3 + -4);
    }
    if (lVar5 < lVar3) {
      do {
        dVar8 = dVar8 + sx[lVar5] * sy[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar3 != lVar5);
    }
  }
  else {
    lVar5 = (1 - lVar3) * (long)iVar2;
    if (-1 < iVar2) {
      lVar5 = 0;
    }
    lVar7 = (1 - lVar3) * (long)iVar1;
    if (-1 < iVar1) {
      lVar7 = 0;
    }
    pdVar4 = sy + lVar5;
    pdVar6 = sx + lVar7;
    dVar8 = 0.0;
    do {
      dVar8 = dVar8 + *pdVar6 * *pdVar4;
      pdVar4 = pdVar4 + iVar2;
      pdVar6 = pdVar6 + iVar1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return dVar8;
}

Assistant:

double ddot_(int *n, double *sx, int *incx, double *sy, int *incy)
{
  long int i, m, nn, iincx, iincy;
  double stemp;
  long int ix, iy;

  /* forms the dot product of two vectors.   
     uses unrolled loops for increments equal to one.   
     jack dongarra, linpack, 3/11/78.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;
  iincy = *incy;

  stemp = 0.0;
  if (nn > 0)
  {
    if (iincx == 1 && iincy == 1) /* code for both increments equal to 1 */
    {
      m = nn-4;
      for (i = 0; i < m; i += 5)
        stemp += sx[i] * sy[i] + sx[i+1] * sy[i+1] + sx[i+2] * sy[i+2] +
                 sx[i+3] * sy[i+3] + sx[i+4] * sy[i+4];

      for ( ; i < nn; i++)        /* clean-up loop */
        stemp += sx[i] * sy[i];
    }
    else /* code for unequal increments or equal increments not equal to 1 */
    {
      ix = 0;
      iy = 0;
      if (iincx < 0)
        ix = (1 - nn) * iincx;
      if (iincy < 0)
        iy = (1 - nn) * iincy;
      for (i = 0; i < nn; i++)
      {
        stemp += sx[ix] * sy[iy];
        ix += iincx;
        iy += iincy;
      }
    }
  }

  return stemp;
}